

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::positiveTesting
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  bool bVar1;
  bool bVar2;
  GLenum GVar3;
  GLint GVar4;
  GLint pageSizeY;
  GLint pageSizeX;
  GLint pageSizeZ;
  GLuint texture;
  GLuint local_40;
  GLuint local_3c;
  int local_38;
  GLuint local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Positive Testing - ",0x13);
  gl4cts::Texture::Generate(gl,&local_34);
  (*gl->bindTexture)(target,local_34);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  GVar4 = SparseTextureUtils::getTargetDepth(target);
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,(GLint *)&local_3c,(GLint *)&local_40,&local_38);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar3 = (*gl->getError)();
  bVar2 = false;
  bVar1 = SparseTextureUtils::verifyError(&this->mLog,"texParameteri",GVar3,0);
  if (bVar1) {
    if ((target == 0x8513) || (target == 0x9009)) {
      if ((int)local_40 < (int)local_3c) {
        local_40 = local_3c;
      }
      else if ((int)local_3c < (int)local_40) {
        local_3c = local_40;
      }
    }
    gl4cts::Texture::Storage(gl,target,1,format,local_3c,local_40,GVar4 * local_38);
    GVar3 = (*gl->getError)();
    bVar2 = SparseTextureUtils::verifyError(&this->mLog,"Texture::Storage",GVar3,0);
  }
  (*gl->deleteTextures)(1,&local_34);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xd4);
  return bVar2;
}

Assistant:

bool SparseTextureAllocationTestCase::positiveTesting(const Functions& gl, GLint target, GLint format)
{
	mLog << "Positive Testing - ";

	GLuint texture;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint pageSizeX;
	GLint pageSizeY;
	GLint pageSizeZ;
	GLint depth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyError(mLog, "texParameteri", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (pageSizeX > pageSizeY)
			pageSizeY = pageSizeX;
		else if (pageSizeX < pageSizeY)
			pageSizeX = pageSizeY;
	}

	Texture::Storage(gl, target, 1, format, pageSizeX, pageSizeY, depth * pageSizeZ);
	if (!SparseTextureUtils::verifyError(mLog, "Texture::Storage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}